

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O3

uint64_t anon_unknown.dwarf_3e7fa::hashFile(string *filename)

{
  char *pcVar1;
  ulong uVar2;
  char *local_30;
  vector<char,_std::allocator<char>_> contents;
  long local_20;
  
  uVar2 = 0;
  wasm::read_file<std::vector<char,std::allocator<char>>>
            ((string *)&local_30,(BinaryOption)filename);
  if (local_30 != _contents) {
    uVar2 = 0;
    pcVar1 = local_30;
    do {
      uVar2 = (uVar2 >> 4) + uVar2 * 0x1000 + -0x61c8864680b583eb + (long)*pcVar1 ^ uVar2;
      pcVar1 = pcVar1 + 1;
    } while (pcVar1 != _contents);
  }
  if (local_30 != (char *)0x0) {
    operator_delete(local_30,local_20 - (long)local_30);
  }
  return uVar2;
}

Assistant:

uint64_t hashFile(const std::string& filename) {
  auto contents(read_file<std::vector<char>>(filename, Flags::Binary));
  size_t digest = 0;
  // Don't use `hash` or `rehash` - they aren't deterministic between executions
  for (char c : contents) {
    hash_combine(digest, c);
  }
  return uint64_t(digest);
}